

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.cpp
# Opt level: O2

void __thiscall OpenMD::Bend::calcForce(Bend *this,RealType *angle,bool doParticlePot)

{
  RealType *particlePot;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double __x;
  RealType dVdTheta;
  Vector3d force2;
  Vector3d r23;
  Vector3d force3;
  Vector3d force1;
  Vector3d r21;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  double local_158;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  StuntDouble::getPos((Vector3d *)&local_48,
                      &(*(this->super_ShortRangeInteraction).atoms_.
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_60,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_78,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[2]->super_StuntDouble);
  operator-(&local_120,&local_48,&local_60);
  Vector<double,_3U>::Vector(&local_a8,&local_120);
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,
             (Vector3d *)&local_a8);
  dVar1 = Vector<double,_3U>::length(&local_a8);
  operator-(&local_c0,&local_78,&local_60);
  Vector<double,_3U>::Vector(&local_120,&local_c0);
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,
             (Vector3d *)&local_120);
  dVar2 = Vector<double,_3U>::length(&local_120);
  dVar3 = dot<double,3u>(&local_a8,&local_120);
  dVar3 = dVar3 / (dVar1 * dVar2);
  __x = 1.0;
  if ((dVar3 <= 1.0) && (__x = dVar3, dVar3 < -1.0)) {
    __x = -1.0;
  }
  dVar1 = 1.0 / dVar1;
  dVar2 = 1.0 / dVar2;
  dVar3 = acos(__x);
  particlePot = &this->potential_;
  (*this->bendType_->_vptr_BendType[2])(this->bendType_,particlePot,&local_158);
  dVar4 = 1.0 - __x * __x;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = local_158 /
          (double)(~-(ulong)(ABS(dVar4) < 1e-06) & (ulong)dVar4 |
                  -(ulong)(ABS(dVar4) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
  operator*(&local_150,&local_120,dVar2);
  operator*(&local_108,&local_a8,dVar1);
  operator*(&local_f0,&local_108,__x);
  operator-(&local_138,&local_150,&local_f0);
  operator*(&local_d8,dVar1 * dVar4,&local_138);
  Vector<double,_3U>::Vector(&local_c0,&local_d8);
  operator*(&local_f0,&local_a8,dVar1);
  operator*(&local_90,&local_120,dVar2);
  operator*(&local_108,&local_90,__x);
  operator-(&local_150,&local_f0,&local_108);
  operator*(&local_138,dVar4 * dVar2,&local_150);
  Vector<double,_3U>::Vector(&local_d8,&local_138);
  operator+(&local_150,&local_c0,&local_d8);
  Vector<double,_3U>::Vector(&local_138,&local_150);
  Vector<double,_3U>::mul(&local_138,-1.0);
  StuntDouble::addFrc(&(*(this->super_ShortRangeInteraction).atoms_.
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->super_StuntDouble,(Vector3d *)&local_c0
                     );
  StuntDouble::addFrc(&(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble,(Vector3d *)&local_138
                     );
  StuntDouble::addFrc(&(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[2]->super_StuntDouble,(Vector3d *)&local_d8)
  ;
  if (doParticlePot) {
    StuntDouble::addParticlePot
              (&(*(this->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_StuntDouble,particlePot);
    StuntDouble::addParticlePot
              (&(this->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start[1]->super_StuntDouble,particlePot);
    StuntDouble::addParticlePot
              (&(this->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]->super_StuntDouble,particlePot);
  }
  *angle = (dVar3 / 3.141592653589793) * 180.0;
  return;
}

Assistant:

void Bend::calcForce(RealType& angle, bool doParticlePot) {
    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = atoms_[2]->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    RealType d21 = r21.length();

    RealType d21inv = 1.0 / d21;

    Vector3d r23 = pos3 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r23);
    RealType d23 = r23.length();

    RealType d23inv = 1.0 / d23;

    RealType cosTheta = dot(r21, r23) / (d21 * d23);

    // check roundoff
    if (cosTheta > 1.0) {
      cosTheta = 1.0;
    } else if (cosTheta < -1.0) {
      cosTheta = -1.0;
    }

    RealType theta = acos(cosTheta);

    RealType dVdTheta;

    bendType_->calcForce(theta, potential_, dVdTheta);

    RealType sinTheta = sqrt(1.0 - cosTheta * cosTheta);

    if (fabs(sinTheta) < 1.0E-6) { sinTheta = 1.0E-6; }

    RealType commonFactor1 = dVdTheta / sinTheta * d21inv;
    RealType commonFactor2 = dVdTheta / sinTheta * d23inv;

    Vector3d force1 = commonFactor1 * (r23 * d23inv - r21 * d21inv * cosTheta);
    Vector3d force3 = commonFactor2 * (r21 * d21inv - r23 * d23inv * cosTheta);

    // Total force in current bend is zero
    Vector3d force2 = force1 + force3;
    force2 *= -1.0;

    atoms_[0]->addFrc(force1);
    atoms_[1]->addFrc(force2);
    atoms_[2]->addFrc(force3);

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      atoms_[2]->addParticlePot(potential_);
    }

    angle = theta / Constants::PI * 180.0;
  }